

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_record(void)

{
  undefined1 *this;
  bool bVar1;
  char *pcVar2;
  uchar (*in_RDX) [2];
  uchar (*input_00) [10];
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_250;
  const_iterator local_230;
  const_iterator local_218;
  iterator local_200;
  iterator local_1e8;
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_168 [24];
  basic_variable<std::allocator<char>_> expected_1;
  basic_variable<std::allocator<char>_> result_1;
  value_type input_1 [10];
  const_iterator local_d0;
  iterator local_b8;
  iterator local_a0;
  undefined1 local_88 [8];
  basic_variable<std::allocator<char>_> expected;
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  undefined2 local_a [4];
  value_type input [2];
  
  local_a[0] = 0x9190;
  trial::protocol::bintoken::parse<unsigned_char[2],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,(bintoken *)local_a,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_48);
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x184,"void parser_suite::parse_record()",bVar1);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a0,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_b8,(basic_variable<std::allocator<char>_> *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d0,(basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            ((const_iterator *)(input_1 + 8),(basic_variable<std::allocator<char>_> *)local_88);
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x188,"void parser_suite::parse_record()",&local_a0,&local_b8,&local_d0,input_1 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator
            ((const_iterator *)(input_1 + 8));
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  result_1.storage._40_8_ = 0x7fb243424103a990;
  input_1[0] = '\0';
  input_1[1] = 0x91;
  this = &expected_1.storage.field_0x28;
  trial::protocol::bintoken::parse<unsigned_char[10],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)this,(bintoken *)&result_1.storage.field_0x28,
             input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)this);
  pcVar2 = "void parser_suite::parse_record()";
  boost::detail::test_impl
            ("result.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x192,"void parser_suite::parse_record()",bVar1);
  local_1d0 = &local_1c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,"ABC");
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,0x7f);
  local_168._0_8_ = &local_1c8;
  local_168._8_8_ = 2;
  init._M_len = (size_type)pcVar2;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_array<std::allocator<char>_> *)local_168._0_8_,init);
  local_250 = (basic_variable<std::allocator<char>_> *)local_168;
  do {
    local_250 = local_250 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_250);
  } while (local_250 != &local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e8,(basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_200,(basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::const_iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>const>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x196,"void parser_suite::parse_record()",&local_1e8,&local_200,&local_218,&local_230)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_230)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator::~const_iterator(&local_218)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&expected_1.storage.field_0x28);
  return;
}

Assistant:

void parse_record()
{
    {
        const value_type input[] = {
            bintoken::token::code::begin_record,
            bintoken::token::code::end_record
        };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make();
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
    {
        const value_type input[] = {
            bintoken::token::code::begin_record,
            bintoken::token::code::string8, 0x03, 0x41, 0x42, 0x43,
            bintoken::token::code::int16, 0x7F, 0x00,
            bintoken::token::code::end_record
        };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<array>());
        const auto expected = array::make({ "ABC", 127 });
        TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                     expected.begin(), expected.end(),
                                     std::equal_to<decltype(expected)>());
    }
}